

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.h
# Opt level: O0

product_type __thiscall
mwheel::
PrototypeFactory<(anonymous_namespace)::Base,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>
::create<>(PrototypeFactory<(anonymous_namespace)::Base,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag)

{
  bool bVar1;
  iterator this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  element_type *in_RDI;
  shared_ptr<(anonymous_namespace)::Base> sVar4;
  product_type pVar5;
  iterator iterator;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x132ce8);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>_>
            ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(local_20,(_Self *)&stack0xffffffffffffffd8);
  if (bVar1) {
    sVar4 = std::
            function<std::shared_ptr<(anonymous_namespace)::Base>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()((function<std::shared_ptr<(anonymous_namespace)::Base>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)this_00._M_node,in_RSI);
    _Var3 = sVar4.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::Base>_>_>
                  *)0x132d35);
    peVar2 = std::
             __shared_ptr_access<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x132d41);
    (**peVar2->_vptr_Base)(in_RDI);
    _Var3._M_pi = extraout_RDX;
  }
  pVar5.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  pVar5.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (product_type)
         pVar5.super___shared_ptr<(anonymous_namespace)::Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

product_type create(const TagType &tag, ParameterTypes... parameters) {
    auto iterator = m_prototype_map.find(tag);
    if (iterator == m_prototype_map.end()) {
      return m_on_tag_not_registered(tag);
    }
    return iterator->second->clone(parameters...);
  }